

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void RenderArrowsForVerticalBar
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w,float alpha)

{
  ImVec2 half_sz_00;
  ImVec2 half_sz_01;
  ImVec2 half_sz_02;
  ImVec2 half_sz_03;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 pos_03;
  float fVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImU32 alpha8;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50 [2];
  float local_3c;
  ImU32 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImDrawList *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd8;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  fVar1 = ImSaturate(in_XMM3_Da);
  fVar1 = (float)(int)(fVar1 * 255.0 + 0.5);
  local_10 = (float)in_XMM1_Qa;
  local_8 = (float)in_XMM0_Qa;
  fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,local_8 + local_10 + 1.0,fStack_4);
  fStack_c = (float)((ulong)in_XMM1_Qa >> 0x20);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,local_10 + 2.0,fStack_c + 1.0);
  pos_00.y = in_XMM2_Da;
  pos_00.x = in_XMM3_Da;
  half_sz_00.y = fVar1;
  half_sz_00.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_00,half_sz_00,(ImGuiDir)in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  ImVec2::ImVec2((ImVec2 *)&local_50[2].y,local_8 + local_10,fStack_4);
  pos_01.y = in_XMM2_Da;
  pos_01.x = in_XMM3_Da;
  half_sz_01.y = fVar1;
  half_sz_01.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_01,half_sz_01,(ImGuiDir)in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  ImVec2::ImVec2(local_50,((local_8 + in_XMM2_Da) - local_10) - 1.0,fStack_4);
  ImVec2::ImVec2(&local_58,local_10 + 2.0,fStack_c + 1.0);
  pos_02.y = in_XMM2_Da;
  pos_02.x = in_XMM3_Da;
  half_sz_02.y = fVar1;
  half_sz_02.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_02,half_sz_02,(ImGuiDir)in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  ImVec2::ImVec2(&local_60,(local_8 + in_XMM2_Da) - local_10,fStack_4);
  pos_03.y = in_XMM2_Da;
  pos_03.x = in_XMM3_Da;
  half_sz_03.y = fVar1;
  half_sz_03.x = in_stack_ffffffffffffffd8;
  ImGui::RenderArrowPointingAt
            (in_stack_ffffffffffffffd0,pos_03,half_sz_03,(ImGuiDir)in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w, float alpha)
{
    ImU32 alpha8 = IM_F32_TO_INT8_SAT(alpha);
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32(255,255,255,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32(255,255,255,alpha8));
}